

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_inquisitor.cpp
# Opt level: O2

bool InquisitorCheckDistance(AActor *self)

{
  bool bVar1;
  AActor *pAVar2;
  bool bVar3;
  double dVar4;
  
  if (self->reactiontime == 0) {
    pAVar2 = GC::ReadBarrier<AActor>((AActor **)&self->target);
    bVar3 = false;
    bVar1 = P_CheckSight(self,pAVar2,0);
    if (bVar1) {
      pAVar2 = GC::ReadBarrier<AActor>((AActor **)&self->target);
      dVar4 = AActor::Distance2D(self,pAVar2,false);
      bVar3 = dVar4 < 264.0;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool InquisitorCheckDistance (AActor *self)
{
	if (self->reactiontime == 0 && P_CheckSight (self, self->target))
	{
		return self->Distance2D (self->target) < 264.;
	}
	return false;
}